

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void Excel::Parser::handleNUMBER(Record *record,size_t sheetIdx,IStorage *storage)

{
  RecordSubstream *this;
  int16_t column;
  int16_t row;
  size_t local_40;
  anon_union_8_2_224970c8 doubleAndLongLong;
  
  row = 0;
  column = 0;
  this = &record->m_stream;
  local_40 = sheetIdx;
  Stream::read<short>(&this->super_Stream,&row,2);
  Stream::read<short>(&this->super_Stream,&column,2);
  (*(record->m_stream).super_Stream._vptr_Stream[4])(this,2,1);
  Stream::read<unsigned_long>(&this->super_Stream,&doubleAndLongLong.m_asLongLong,8);
  (*storage->_vptr_IStorage[7])
            (doubleAndLongLong.m_asDouble,storage,local_40,(long)row,(long)column);
  return;
}

Assistant:

inline void
Parser::handleNUMBER( Record & record, size_t sheetIdx, IStorage & storage )
{
	int16_t row = 0;
	int16_t column = 0;

	record.dataStream().read( row, 2 );
	record.dataStream().read( column, 2 );

	record.dataStream().seek( 2, Stream::FromCurrent );

	union {
		double m_asDouble;
		uint64_t m_asLongLong;
	} doubleAndLongLong;

	record.dataStream().read( doubleAndLongLong.m_asLongLong, 8 );

	storage.onCell( sheetIdx, row, column, doubleAndLongLong.m_asDouble );
}